

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

void __thiscall Application::fail(Application *this)

{
  Log *pLVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  Member *pMVar5;
  int local_14;
  int removed;
  int i;
  Application *this_local;
  
  if ((this->par->DROP_MSG != 0) && (iVar3 = Params::getcurrtime(this->par), iVar3 == 0x32)) {
    this->par->dropmsg = 1;
  }
  if ((this->par->SINGLE_FAILURE == 0) || (iVar3 = Params::getcurrtime(this->par), iVar3 != 100)) {
    iVar3 = Params::getcurrtime(this->par);
    if (iVar3 == 100) {
      iVar3 = rand();
      uVar2 = (long)iVar3 % (long)this->par->EN_GPSZ;
      iVar3 = (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) / 2);
      for (local_14 = iVar3; local_14 < iVar3 + this->par->EN_GPSZ / 2; local_14 = local_14 + 1) {
        pLVar1 = this->log;
        pMVar5 = MP1Node::getMemberNode(this->mp1[local_14]);
        uVar4 = Params::getcurrtime(this->par);
        Log::LOG(pLVar1,&pMVar5->addr,"Node failed at time = %d",(ulong)uVar4);
        pMVar5 = MP1Node::getMemberNode(this->mp1[local_14]);
        pMVar5->bFailed = true;
      }
    }
  }
  else {
    iVar3 = rand();
    iVar3 = iVar3 % this->par->EN_GPSZ;
    pLVar1 = this->log;
    pMVar5 = MP1Node::getMemberNode(this->mp1[iVar3]);
    uVar4 = Params::getcurrtime(this->par);
    Log::LOG(pLVar1,&pMVar5->addr,"Node failed at time=%d",(ulong)uVar4);
    pMVar5 = MP1Node::getMemberNode(this->mp1[iVar3]);
    pMVar5->bFailed = true;
  }
  if ((this->par->DROP_MSG != 0) && (iVar3 = Params::getcurrtime(this->par), iVar3 == 300)) {
    this->par->dropmsg = 0;
  }
  return;
}

Assistant:

void Application::fail() {
	int i, removed;

	// fail half the members at time t=400
	if( par->DROP_MSG && par->getcurrtime() == 50 ) {
		par->dropmsg = 1;
	}

	if( par->SINGLE_FAILURE && par->getcurrtime() == 100 ) {
		removed = (rand() % par->EN_GPSZ);
		#ifdef DEBUGLOG
		log->LOG(&mp1[removed]->getMemberNode()->addr, "Node failed at time=%d", par->getcurrtime());
		#endif
		mp1[removed]->getMemberNode()->bFailed = true;
	}
	else if( par->getcurrtime() == 100 ) {
		removed = rand() % par->EN_GPSZ/2;
		for ( i = removed; i < removed + par->EN_GPSZ/2; i++ ) {
			#ifdef DEBUGLOG
			log->LOG(&mp1[i]->getMemberNode()->addr, "Node failed at time = %d", par->getcurrtime());
			#endif
			mp1[i]->getMemberNode()->bFailed = true;
		}
	}

	if( par->DROP_MSG && par->getcurrtime() == 300) {
		par->dropmsg=0;
	}

}